

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O3

v256 * v256_max_s8(v256 a,v256 b)

{
  v256 *in_RDI;
  
  *(char *)in_RDI->val[1] =
       ((char)a.val[1][0] < (char)b.val[1][0]) * (char)b.val[1][0] |
       ((char)a.val[1][0] >= (char)b.val[1][0]) * (char)a.val[1][0];
  *(char *)((long)in_RDI->val[1] + 1) =
       (a.val[1][0]._1_1_ < b.val[1][0]._1_1_) * b.val[1][0]._1_1_ |
       (a.val[1][0]._1_1_ >= b.val[1][0]._1_1_) * a.val[1][0]._1_1_;
  *(char *)((long)in_RDI->val[1] + 2) =
       (a.val[1][0]._2_1_ < b.val[1][0]._2_1_) * b.val[1][0]._2_1_ |
       (a.val[1][0]._2_1_ >= b.val[1][0]._2_1_) * a.val[1][0]._2_1_;
  *(char *)((long)in_RDI->val[1] + 3) =
       (a.val[1][0]._3_1_ < b.val[1][0]._3_1_) * b.val[1][0]._3_1_ |
       (a.val[1][0]._3_1_ >= b.val[1][0]._3_1_) * a.val[1][0]._3_1_;
  *(char *)((long)in_RDI->val[1] + 4) =
       (a.val[1][0]._4_1_ < b.val[1][0]._4_1_) * b.val[1][0]._4_1_ |
       (a.val[1][0]._4_1_ >= b.val[1][0]._4_1_) * a.val[1][0]._4_1_;
  *(char *)((long)in_RDI->val[1] + 5) =
       (a.val[1][0]._5_1_ < b.val[1][0]._5_1_) * b.val[1][0]._5_1_ |
       (a.val[1][0]._5_1_ >= b.val[1][0]._5_1_) * a.val[1][0]._5_1_;
  *(char *)((long)in_RDI->val[1] + 6) =
       (a.val[1][0]._6_1_ < b.val[1][0]._6_1_) * b.val[1][0]._6_1_ |
       (a.val[1][0]._6_1_ >= b.val[1][0]._6_1_) * a.val[1][0]._6_1_;
  *(char *)((long)in_RDI->val[1] + 7) =
       (a.val[1][0]._7_1_ < b.val[1][0]._7_1_) * b.val[1][0]._7_1_ |
       (a.val[1][0]._7_1_ >= b.val[1][0]._7_1_) * a.val[1][0]._7_1_;
  *(char *)(in_RDI->val[1] + 1) =
       ((char)a.val[1][1] < (char)b.val[1][1]) * (char)b.val[1][1] |
       ((char)a.val[1][1] >= (char)b.val[1][1]) * (char)a.val[1][1];
  *(char *)((long)in_RDI->val[1] + 9) =
       (a.val[1][1]._1_1_ < b.val[1][1]._1_1_) * b.val[1][1]._1_1_ |
       (a.val[1][1]._1_1_ >= b.val[1][1]._1_1_) * a.val[1][1]._1_1_;
  *(char *)((long)in_RDI->val[1] + 10) =
       (a.val[1][1]._2_1_ < b.val[1][1]._2_1_) * b.val[1][1]._2_1_ |
       (a.val[1][1]._2_1_ >= b.val[1][1]._2_1_) * a.val[1][1]._2_1_;
  *(char *)((long)in_RDI->val[1] + 0xb) =
       (a.val[1][1]._3_1_ < b.val[1][1]._3_1_) * b.val[1][1]._3_1_ |
       (a.val[1][1]._3_1_ >= b.val[1][1]._3_1_) * a.val[1][1]._3_1_;
  *(char *)((long)in_RDI->val[1] + 0xc) =
       (a.val[1][1]._4_1_ < b.val[1][1]._4_1_) * b.val[1][1]._4_1_ |
       (a.val[1][1]._4_1_ >= b.val[1][1]._4_1_) * a.val[1][1]._4_1_;
  *(char *)((long)in_RDI->val[1] + 0xd) =
       (a.val[1][1]._5_1_ < b.val[1][1]._5_1_) * b.val[1][1]._5_1_ |
       (a.val[1][1]._5_1_ >= b.val[1][1]._5_1_) * a.val[1][1]._5_1_;
  *(char *)((long)in_RDI->val[1] + 0xe) =
       (a.val[1][1]._6_1_ < b.val[1][1]._6_1_) * b.val[1][1]._6_1_ |
       (a.val[1][1]._6_1_ >= b.val[1][1]._6_1_) * a.val[1][1]._6_1_;
  *(char *)((long)in_RDI->val[1] + 0xf) =
       (a.val[1][1]._7_1_ < b.val[1][1]._7_1_) * b.val[1][1]._7_1_ |
       (a.val[1][1]._7_1_ >= b.val[1][1]._7_1_) * a.val[1][1]._7_1_;
  *(char *)in_RDI->val[0] =
       ((char)a.val[0][0] < (char)b.val[0][0]) * (char)b.val[0][0] |
       ((char)a.val[0][0] >= (char)b.val[0][0]) * (char)a.val[0][0];
  *(char *)((long)in_RDI->val[0] + 1) =
       (a.val[0][0]._1_1_ < b.val[0][0]._1_1_) * b.val[0][0]._1_1_ |
       (a.val[0][0]._1_1_ >= b.val[0][0]._1_1_) * a.val[0][0]._1_1_;
  *(char *)((long)in_RDI->val[0] + 2) =
       (a.val[0][0]._2_1_ < b.val[0][0]._2_1_) * b.val[0][0]._2_1_ |
       (a.val[0][0]._2_1_ >= b.val[0][0]._2_1_) * a.val[0][0]._2_1_;
  *(char *)((long)in_RDI->val[0] + 3) =
       (a.val[0][0]._3_1_ < b.val[0][0]._3_1_) * b.val[0][0]._3_1_ |
       (a.val[0][0]._3_1_ >= b.val[0][0]._3_1_) * a.val[0][0]._3_1_;
  *(char *)((long)in_RDI->val[0] + 4) =
       (a.val[0][0]._4_1_ < b.val[0][0]._4_1_) * b.val[0][0]._4_1_ |
       (a.val[0][0]._4_1_ >= b.val[0][0]._4_1_) * a.val[0][0]._4_1_;
  *(char *)((long)in_RDI->val[0] + 5) =
       (a.val[0][0]._5_1_ < b.val[0][0]._5_1_) * b.val[0][0]._5_1_ |
       (a.val[0][0]._5_1_ >= b.val[0][0]._5_1_) * a.val[0][0]._5_1_;
  *(char *)((long)in_RDI->val[0] + 6) =
       (a.val[0][0]._6_1_ < b.val[0][0]._6_1_) * b.val[0][0]._6_1_ |
       (a.val[0][0]._6_1_ >= b.val[0][0]._6_1_) * a.val[0][0]._6_1_;
  *(char *)((long)in_RDI->val[0] + 7) =
       (a.val[0][0]._7_1_ < b.val[0][0]._7_1_) * b.val[0][0]._7_1_ |
       (a.val[0][0]._7_1_ >= b.val[0][0]._7_1_) * a.val[0][0]._7_1_;
  *(char *)(in_RDI->val[0] + 1) =
       ((char)a.val[0][1] < (char)b.val[0][1]) * (char)b.val[0][1] |
       ((char)a.val[0][1] >= (char)b.val[0][1]) * (char)a.val[0][1];
  *(char *)((long)in_RDI->val[0] + 9) =
       (a.val[0][1]._1_1_ < b.val[0][1]._1_1_) * b.val[0][1]._1_1_ |
       (a.val[0][1]._1_1_ >= b.val[0][1]._1_1_) * a.val[0][1]._1_1_;
  *(char *)((long)in_RDI->val[0] + 10) =
       (a.val[0][1]._2_1_ < b.val[0][1]._2_1_) * b.val[0][1]._2_1_ |
       (a.val[0][1]._2_1_ >= b.val[0][1]._2_1_) * a.val[0][1]._2_1_;
  *(char *)((long)in_RDI->val[0] + 0xb) =
       (a.val[0][1]._3_1_ < b.val[0][1]._3_1_) * b.val[0][1]._3_1_ |
       (a.val[0][1]._3_1_ >= b.val[0][1]._3_1_) * a.val[0][1]._3_1_;
  *(char *)((long)in_RDI->val[0] + 0xc) =
       (a.val[0][1]._4_1_ < b.val[0][1]._4_1_) * b.val[0][1]._4_1_ |
       (a.val[0][1]._4_1_ >= b.val[0][1]._4_1_) * a.val[0][1]._4_1_;
  *(char *)((long)in_RDI->val[0] + 0xd) =
       (a.val[0][1]._5_1_ < b.val[0][1]._5_1_) * b.val[0][1]._5_1_ |
       (a.val[0][1]._5_1_ >= b.val[0][1]._5_1_) * a.val[0][1]._5_1_;
  *(char *)((long)in_RDI->val[0] + 0xe) =
       (a.val[0][1]._6_1_ < b.val[0][1]._6_1_) * b.val[0][1]._6_1_ |
       (a.val[0][1]._6_1_ >= b.val[0][1]._6_1_) * a.val[0][1]._6_1_;
  *(char *)((long)in_RDI->val[0] + 0xf) =
       (a.val[0][1]._7_1_ < b.val[0][1]._7_1_) * b.val[0][1]._7_1_ |
       (a.val[0][1]._7_1_ >= b.val[0][1]._7_1_) * a.val[0][1]._7_1_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_max_s8(v256 a, v256 b) {
  return v256_from_v128(v128_max_s8(a.val[1], b.val[1]),
                        v128_max_s8(a.val[0], b.val[0]));
}